

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

Rtm_Man_t * Rtm_ManFromAig(Aig_Man_t *p)

{
  Rtm_Obj_t *pRVar1;
  int iVar2;
  int iVar3;
  Rtm_Man_t *pRtm_00;
  Aig_Obj_t *pAVar4;
  Rtm_Obj_t *pRVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  int local_34;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Rtm_Man_t *pRtm;
  Aig_Man_t *p_local;
  
  iVar2 = Aig_ManRegNum(p);
  if (iVar2 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                  ,0x2a8,"Rtm_Man_t *Rtm_ManFromAig(Aig_Man_t *)");
  }
  iVar2 = Aig_ManBufNum(p);
  if (iVar2 != 0) {
    __assert_fail("Aig_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                  ,0x2a9,"Rtm_Man_t *Rtm_ManFromAig(Aig_Man_t *)");
  }
  pRtm_00 = Rtm_ManAlloc(p);
  pAVar4 = Aig_ManConst1(p);
  pRVar5 = Rtm_ObjAlloc(pRtm_00,0,(uint)(*(ulong *)&pAVar4->field_0x18 >> 6) & 0x3ffffff);
  (pAVar4->field_5).pData = pRVar5;
  local_34 = 0;
  while( true ) {
    iVar2 = Aig_ManCiNum(p);
    iVar3 = Aig_ManRegNum(p);
    if (iVar2 - iVar3 <= local_34) break;
    pvVar6 = Vec_PtrEntry(p->vCis,local_34);
    pRVar5 = Rtm_ObjAlloc(pRtm_00,0,(uint)(*(ulong *)((long)pvVar6 + 0x18) >> 6) & 0x3ffffff);
    *(Rtm_Obj_t **)((long)pvVar6 + 0x28) = pRVar5;
    Vec_PtrPush(pRtm_00->vPis,*(void **)((long)pvVar6 + 0x28));
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar2 = Aig_ManCoNum(p);
    iVar3 = Aig_ManRegNum(p);
    if (iVar2 - iVar3 <= local_34) break;
    pvVar6 = Vec_PtrEntry(p->vCos,local_34);
    pRVar5 = Rtm_ObjAlloc(pRtm_00,1,0);
    *(Rtm_Obj_t **)((long)pvVar6 + 0x28) = pRVar5;
    Vec_PtrPush(pRtm_00->vPos,*(void **)((long)pvVar6 + 0x28));
    local_34 = local_34 + 1;
  }
  local_34 = Aig_ManCiNum(p);
  iVar2 = Aig_ManRegNum(p);
  for (local_34 = local_34 - iVar2; iVar2 = Vec_PtrSize(p->vCis), local_34 < iVar2;
      local_34 = local_34 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,local_34);
    pRVar5 = Rtm_ObjAlloc(pRtm_00,1,(uint)(*(ulong *)((long)pvVar6 + 0x18) >> 6) & 0x3ffffff);
    *(Rtm_Obj_t **)((long)pvVar6 + 0x28) = pRVar5;
  }
  local_34 = Aig_ManCoNum(p);
  iVar2 = Aig_ManRegNum(p);
  for (local_34 = local_34 - iVar2; iVar2 = Vec_PtrSize(p->vCos), local_34 < iVar2;
      local_34 = local_34 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCos,local_34);
    pRVar5 = Rtm_ObjAlloc(pRtm_00,1,1);
    *(Rtm_Obj_t **)((long)pvVar6 + 0x28) = pRVar5;
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(p->vObjs), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar4), iVar2 != 0)) {
      pRVar5 = Rtm_ObjAlloc(pRtm_00,2,(uint)(*(ulong *)&pAVar4->field_0x18 >> 6) & 0x3ffffff);
      (pAVar4->field_5).pData = pRVar5;
    }
  }
  local_34 = 0;
  while( true ) {
    iVar2 = Aig_ManCoNum(p);
    iVar3 = Aig_ManRegNum(p);
    if (iVar2 - iVar3 <= local_34) break;
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
    pRVar5 = (Rtm_Obj_t *)(pAVar4->field_5).pData;
    pAVar7 = Aig_ObjFanin0(pAVar4);
    pRVar1 = (Rtm_Obj_t *)(pAVar7->field_5).pData;
    iVar2 = Aig_ObjFaninC0(pAVar4);
    Rtm_ObjAddFanin(pRVar5,pRVar1,iVar2);
    local_34 = local_34 + 1;
  }
  local_34 = Aig_ManCoNum(p);
  iVar2 = Aig_ManRegNum(p);
  for (local_34 = local_34 - iVar2; iVar2 = Vec_PtrSize(p->vCos), local_34 < iVar2;
      local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
    pRVar5 = (Rtm_Obj_t *)(pAVar4->field_5).pData;
    pAVar7 = Aig_ObjFanin0(pAVar4);
    pRVar1 = (Rtm_Obj_t *)(pAVar7->field_5).pData;
    iVar2 = Aig_ObjFaninC0(pAVar4);
    Rtm_ObjAddFanin(pRVar5,pRVar1,iVar2);
  }
  for (local_34 = 0; iVar2 = Aig_ManRegNum(p), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar4 = Aig_ManLi(p,local_34);
    pAVar7 = Aig_ManLo(p,local_34);
    Rtm_ObjAddFanin((Rtm_Obj_t *)(pAVar7->field_5).pData,(Rtm_Obj_t *)(pAVar4->field_5).pData,0);
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(p->vObjs), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar4), iVar2 != 0)) {
      pRVar5 = (Rtm_Obj_t *)(pAVar4->field_5).pData;
      pAVar7 = Aig_ObjFanin0(pAVar4);
      pRVar1 = (Rtm_Obj_t *)(pAVar7->field_5).pData;
      iVar2 = Aig_ObjFaninC0(pAVar4);
      Rtm_ObjAddFanin(pRVar5,pRVar1,iVar2);
      pRVar5 = (Rtm_Obj_t *)(pAVar4->field_5).pData;
      pAVar7 = Aig_ObjFanin1(pAVar4);
      pRVar1 = (Rtm_Obj_t *)(pAVar7->field_5).pData;
      iVar2 = Aig_ObjFaninC1(pAVar4);
      Rtm_ObjAddFanin(pRVar5,pRVar1,iVar2);
    }
  }
  return pRtm_00;
}

Assistant:

Rtm_Man_t * Rtm_ManFromAig( Aig_Man_t * p )
{
    Rtm_Man_t * pRtm;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    assert( Aig_ManBufNum(p) == 0 );
    // allocate the manager
    pRtm = Rtm_ManAlloc( p );
    // allocate objects
    pObj = Aig_ManConst1(p);
    pObj->pData = Rtm_ObjAlloc( pRtm, 0, pObj->nRefs );
    Aig_ManForEachPiSeq( p, pObj, i )
    {
        pObj->pData = Rtm_ObjAlloc( pRtm, 0, pObj->nRefs );
        Vec_PtrPush( pRtm->vPis, pObj->pData );
    }
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        pObj->pData = Rtm_ObjAlloc( pRtm, 1, 0 );
        Vec_PtrPush( pRtm->vPos, pObj->pData );
    }
    Aig_ManForEachLoSeq( p, pObj, i )
        pObj->pData = Rtm_ObjAlloc( pRtm, 1, pObj->nRefs );
    Aig_ManForEachLiSeq( p, pObj, i )
        pObj->pData = Rtm_ObjAlloc( pRtm, 1, 1 );
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Rtm_ObjAlloc( pRtm, 2, pObj->nRefs );
    // connect objects
    Aig_ManForEachPoSeq( p, pObj, i )
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
    Aig_ManForEachLiSeq( p, pObj, i )
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObjLo->pData, (Rtm_Obj_t *)pObjLi->pData, 0 );
    Aig_ManForEachNode( p, pObj, i )
    {
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        Rtm_ObjAddFanin( (Rtm_Obj_t *)pObj->pData, (Rtm_Obj_t *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
    }
    return pRtm;
}